

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O2

uint __thiscall
QFragmentMapData<QTextBlockData>::insert_single
          (QFragmentMapData<QTextBlockData> *this,int key,uint length)

{
  int *piVar1;
  uint uVar2;
  Header *pHVar3;
  uint x;
  long lVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  Header *pHVar10;
  ulong uVar11;
  
  x = createFragment(this);
  lVar4 = (ulong)x * 0x48;
  *(undefined4 *)((long)(this->field_0).head + lVar4 + 4) = 0;
  *(undefined4 *)((long)(this->field_0).head + lVar4 + 8) = 0;
  (this->field_0).fragments[x].super_QFragment<3>.size_array[0] = length;
  for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
    *(undefined4 *)((long)(this->field_0).head + lVar8 * 4 + lVar4 + 0x20) = 1;
  }
  for (lVar8 = 0; pHVar3 = (this->field_0).head, lVar8 != 3; lVar8 = lVar8 + 1) {
    *(undefined4 *)((long)pHVar3 + lVar8 * 4 + lVar4 + 0x10) = 0;
  }
  bVar9 = false;
  uVar7 = 0;
  pHVar10 = pHVar3;
  while (uVar11 = (ulong)pHVar10->root, uVar11 != 0) {
    lVar6 = uVar11 * 0x48;
    uVar2 = *(uint *)((long)pHVar3 + lVar6 + 0x10);
    bVar9 = uVar2 < (uint)key;
    lVar8 = 4;
    if (uVar2 < (uint)key) {
      key = key - (uVar2 + *(int *)((long)pHVar3 + lVar6 + 0x1c));
      lVar8 = 8;
    }
    uVar7 = uVar11;
    pHVar10 = (Header *)((long)pHVar3 + lVar8 + lVar6);
  }
  *(int *)((long)pHVar3 + lVar4) = (int)uVar7;
  pHVar3 = (this->field_0).head;
  if ((int)uVar7 == 0) {
    pHVar3->root = x;
  }
  else if (bVar9) {
    *(uint *)((long)pHVar3 + uVar7 * 0x48 + 8) = x;
  }
  else {
    *(uint *)((long)pHVar3 + uVar7 * 0x48 + 4) = x;
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      *(undefined4 *)((long)(this->field_0).head + lVar8 * 4 + uVar7 * 0x48 + 0x10) =
           *(undefined4 *)((long)(this->field_0).head + lVar8 * 4 + lVar4 + 0x1c);
    }
  }
  while (iVar5 = (int)uVar7, iVar5 != 0) {
    uVar2 = *(uint *)((long)(this->field_0).head + uVar7 * 0x48);
    uVar7 = (ulong)uVar2;
    if (uVar7 == 0) break;
    if (*(int *)((long)(this->field_0).head + uVar7 * 0x48 + 4) == iVar5) {
      for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
        piVar1 = (int *)((long)(this->field_0).head + lVar8 * 4 + uVar7 * 0x48 + 0x10);
        *piVar1 = *piVar1 + *(int *)((long)(this->field_0).head + lVar8 * 4 + lVar4 + 0x1c);
      }
      uVar7 = (ulong)uVar2;
    }
  }
  rebalance(this,x);
  return x;
}

Assistant:

uint QFragmentMapData<Fragment>::insert_single(int key, uint length)
{
    Q_ASSERT(!findNode(key) || (int)this->position(findNode(key)) == key);

    uint z = createFragment();

    F(z).left = 0;
    F(z).right = 0;
    F(z).size_array[0] = length;
    for (uint field = 1; field < Fragment::size_array_max; ++field)
        F(z).size_array[field] = 1;
    for (uint field = 0; field < Fragment::size_array_max; ++field)
        F(z).size_left_array[field] = 0;

    uint y = 0;
    uint x = root();

    Q_ASSERT(!x || F(x).parent == 0);

    uint s = key;
    bool right = false;
    while (x) {
        y = x;
        if (s <= F(x).size_left_array[0]) {
            x = F(x).left;
            right = false;
        } else {
            s -= F(x).size_left_array[0] + F(x).size_array[0];
            x = F(x).right;
            right = true;
        }
    }

    F(z).parent = y;
    if (!y) {
        head->root = z;
    } else if (!right) {
        F(y).left = z;
        for (uint field = 0; field < Fragment::size_array_max; ++field)
            F(y).size_left_array[field] = F(z).size_array[field];
    } else {
        F(y).right = z;
    }
    while (y && F(y).parent) {
        uint p = F(y).parent;
        if (F(p).left == y) {
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] += F(z).size_array[field];
        }
        y = p;
    }
    rebalance(z);

    return z;
}